

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

AMQPVALUE_DECODER_HANDLE
amqpvalue_decoder_create(ON_VALUE_DECODED on_value_decoded,void *callback_context)

{
  AMQPVALUE_DECODER_HANDLE __ptr;
  undefined4 *__ptr_00;
  INTERNAL_DECODER_DATA *pIVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  void *ref_counted;
  
  if (on_value_decoded == (ON_VALUE_DECODED)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "NULL on_value_decoded";
      iVar3 = 0x1b91;
LAB_001074cc:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_decoder_create",iVar3,1,pcVar4);
      return (AMQPVALUE_DECODER_HANDLE)0x0;
    }
  }
  else {
    __ptr = (AMQPVALUE_DECODER_HANDLE)malloc(0x10);
    if (__ptr == (AMQPVALUE_DECODER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "Could not allocate memory for AMQP value decoder";
        iVar3 = 0x1b9a;
        goto LAB_001074cc;
      }
    }
    else {
      __ptr_00 = (undefined4 *)malloc(0x20);
      if (__ptr_00 == (undefined4 *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_decoder_create",0x1ba2,1,
                    "Could not allocate memory for decoded AMQP value");
        }
      }
      else {
        *__ptr_00 = 1;
        __ptr->decode_to_value = (AMQP_VALUE_DATA *)(__ptr_00 + 2);
        __ptr_00[2] = 0x18;
        pIVar1 = internal_decoder_create
                           (on_value_decoded,callback_context,(AMQP_VALUE_DATA *)(__ptr_00 + 2),
                            false);
        __ptr->internal_decoder = pIVar1;
        if (pIVar1 != (INTERNAL_DECODER_DATA *)0x0) {
          return __ptr;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_decoder_create",0x1bad,1,"Could not create the internal decoder");
        }
        free(__ptr_00);
      }
      free(__ptr);
    }
  }
  return (AMQPVALUE_DECODER_HANDLE)0x0;
}

Assistant:

AMQPVALUE_DECODER_HANDLE amqpvalue_decoder_create(ON_VALUE_DECODED on_value_decoded, void* callback_context)
{
    AMQPVALUE_DECODER_HANDLE_DATA* decoder_instance;

    /* Codes_SRS_AMQPVALUE_01_312: [If the on_value_decoded argument is NULL, amqpvalue_decoder_create shall return NULL.] */
    if (on_value_decoded == NULL)
    {
        LogError("NULL on_value_decoded");
        decoder_instance = NULL;
    }
    else
    {
        decoder_instance = (AMQPVALUE_DECODER_HANDLE_DATA*)malloc(sizeof(AMQPVALUE_DECODER_HANDLE_DATA));
        /* Codes_SRS_AMQPVALUE_01_313: [If creating the decoder fails, amqpvalue_decoder_create shall return NULL.] */
        if (decoder_instance == NULL)
        {
            LogError("Could not allocate memory for AMQP value decoder");
        }
        else
        {
            decoder_instance->decode_to_value = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
            if (decoder_instance->decode_to_value == NULL)
            {
                /* Codes_SRS_AMQPVALUE_01_313: [If creating the decoder fails, amqpvalue_decoder_create shall return NULL.] */
                LogError("Could not allocate memory for decoded AMQP value");
                free(decoder_instance);
                decoder_instance = NULL;
            }
            else
            {
                decoder_instance->decode_to_value->type = AMQP_TYPE_UNKNOWN;
                decoder_instance->internal_decoder = internal_decoder_create(on_value_decoded, callback_context, decoder_instance->decode_to_value, false);
                if (decoder_instance->internal_decoder == NULL)
                {
                    /* Codes_SRS_AMQPVALUE_01_313: [If creating the decoder fails, amqpvalue_decoder_create shall return NULL.] */
                    LogError("Could not create the internal decoder");
                    REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, decoder_instance->decode_to_value);
                    free(decoder_instance);
                    decoder_instance = NULL;
                }
            }
        }
    }

    /* Codes_SRS_AMQPVALUE_01_311: [amqpvalue_decoder_create shall create a new amqp value decoder and return a non-NULL handle to it.] */
    return decoder_instance;
}